

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestFreeze(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  __type _Var3;
  Template *pTVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500 [39];
  allocator local_4d9;
  string local_4d8 [32];
  string local_4b8 [8];
  string pathB;
  allocator local_491;
  string local_490 [32];
  TemplateString local_470;
  TemplateString local_450;
  allocator local_429;
  string local_428 [32];
  ctemplate local_408 [8];
  string incname;
  TemplateString local_3e8;
  TemplateString local_3c8;
  TemplateString local_3a8;
  allocator local_381;
  string local_380 [32];
  TemplateString local_360;
  Template *local_340;
  Template *cache_tpl1_post_reload;
  string local_330 [32];
  TemplateString local_310;
  long local_2f0;
  Template *cache_tpl3;
  string local_2e0 [32];
  ctemplate local_2c0 [8];
  string filename3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [39];
  allocator local_259;
  string local_258 [32];
  string local_238 [8];
  string pathA;
  allocator local_211;
  string local_210 [32];
  TemplateString local_1f0;
  long local_1d0;
  Template *cache_tpl2;
  string local_1c0 [32];
  TemplateString local_1a0;
  Template *local_180;
  Template *cache_tpl1;
  string local_170 [32];
  ctemplate local_150 [8];
  string filename2;
  allocator local_129;
  string local_128 [32];
  ctemplate local_108 [8];
  string filename1;
  TemplateString local_d8;
  TemplateDictionary local_b8 [8];
  TemplateDictionary dict;
  undefined1 local_48 [8];
  TemplateCache cache;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_48);
  ctemplate::TemplateString::TemplateString(&local_d8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_b8,&local_d8,(UnsafeArena *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"{valid template}",&local_129);
  ctemplate::StringToTemplateFile(local_108,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"hi {{>INC:h}} bar\n",(allocator *)((long)&cache_tpl1 + 7))
  ;
  ctemplate::StringToTemplateFile(local_150,(string *)local_170);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache_tpl1 + 7));
  ctemplate::TemplateString::TemplateString(&local_1a0,(string *)local_108);
  pTVar4 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_1a0);
  local_180 = pTVar4;
  if (pTVar4 == (Template *)0x0) {
    __assert_fail("cache_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3d7,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"{valid template}",(allocator *)((long)&cache_tpl2 + 7));
  ctemplate::AssertExpandIs(pTVar4,local_b8,(string *)local_1c0,true);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache_tpl2 + 7));
  ctemplate::TemplateString::TemplateString(&local_1f0,(string *)local_150);
  local_1d0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_1f0);
  if (local_1d0 == 0) {
    __assert_fail("cache_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3da,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"hi  bar\n",&local_211);
  ctemplate::AssertExpandWithCacheIs
            ((TemplateCache *)local_48,(string *)local_150,DO_NOT_STRIP,local_b8,
             (PerExpandData *)0x0,(string *)local_210,true);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"a/",&local_259);
  ctemplate::PathJoin(local_238,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  ctemplate::CreateOrCleanTestDir((string *)local_238);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_48);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var3 = std::operator==(local_280,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_238);
  std::__cxx11::string::~string((string *)local_280);
  if (((_Var3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3e3,"cache.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var3 = std::operator==(local_2a0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_238);
    if (!_Var3) {
      __assert_fail("cache.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3e3,"static void TemplateCacheUnittest::TestFreeze()");
    }
    std::__cxx11::string::~string((string *)local_2a0);
    exit(1);
  }
  ctemplate::TemplateCache::Freeze();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e0,"{yet another valid template}",(allocator *)((long)&cache_tpl3 + 7));
  ctemplate::StringToTemplateFile(local_2c0,(string *)local_2e0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache_tpl3 + 7));
  ctemplate::TemplateString::TemplateString(&local_310,(string *)local_2c0);
  local_2f0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_310);
  if (local_2f0 != 0) {
    __assert_fail("!cache_tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3eb,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_330,"{file1 contents changed}",(allocator *)((long)&cache_tpl1_post_reload + 7));
  ctemplate::StringToFile((string *)local_330,(string *)local_108);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache_tpl1_post_reload + 7));
  ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)local_48);
  ctemplate::TemplateString::TemplateString(&local_360,(string *)local_108);
  pTVar4 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_360);
  local_340 = pTVar4;
  if (pTVar4 != local_180) {
    printf("ASSERT FAILED, line %d: %s\n",0x3f3,"cache_tpl1_post_reload == cache_tpl1");
    if (local_340 == local_180) {
      exit(1);
    }
    __assert_fail("cache_tpl1_post_reload == cache_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3f3,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"{valid template}",&local_381);
  ctemplate::AssertExpandIs(pTVar4,local_b8,(string *)local_380,true);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  ctemplate::TemplateString::TemplateString(&local_3a8,(string *)local_108);
  ctemplate::TemplateCache::Delete((TemplateString *)local_48);
  ctemplate::TemplateString::TemplateString(&local_3c8,(string *)local_108);
  lVar5 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_3c8);
  if (lVar5 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3f9,"cache.GetTemplate(filename1, STRIP_WHITESPACE)");
    ctemplate::TemplateString::TemplateString(&local_3e8,(string *)local_108);
    lVar5 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_3e8);
    if (lVar5 != 0) {
      exit(1);
    }
    __assert_fail("cache.GetTemplate(filename1, STRIP_WHITESPACE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3f9,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"include & print file\n",&local_429);
  ctemplate::StringToTemplateFile(local_408,(string *)local_428);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  ctemplate::TemplateString::TemplateString(&local_450,"INC");
  TVar1.length_ = local_450.length_;
  TVar1.ptr_ = local_450.ptr_;
  TVar1.is_immutable_ = local_450.is_immutable_;
  TVar1._17_7_ = local_450._17_7_;
  TVar1.id_ = local_450.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_470,(string *)local_408);
  TVar2.length_ = local_470.length_;
  TVar2.ptr_ = local_470.ptr_;
  TVar2.is_immutable_ = local_470.is_immutable_;
  TVar2._17_7_ = local_470._17_7_;
  TVar2.id_ = local_470.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"hi  bar\n",&local_491);
  ctemplate::AssertExpandWithCacheIs
            ((TemplateCache *)local_48,(string *)local_150,DO_NOT_STRIP,local_b8,
             (PerExpandData *)0x0,(string *)local_490,false);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d8,"b/",&local_4d9);
  ctemplate::PathJoin(local_4b8,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  ctemplate::CreateOrCleanTestDir((string *)local_4b8);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_48);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var3 = std::operator==(local_500,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_238);
  std::__cxx11::string::~string((string *)local_500);
  if (((_Var3 ^ 0xffU) & 1) == 0) {
    ctemplate::CreateOrCleanTestDir((string *)local_238);
    ctemplate::CreateOrCleanTestDir((string *)local_4b8);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string((string *)local_408);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)local_108);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_b8);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_48);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x405,"cache.template_root_directory() == pathA");
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var3 = std::operator==(local_520,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_238);
  if (!_Var3) {
    __assert_fail("cache.template_root_directory() == pathA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x405,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::__cxx11::string::~string((string *)local_520);
  exit(1);
}

Assistant:

static void TestFreeze() {
    TemplateCache cache;
     TemplateDictionary dict("dict");

    // Load some templates
    string filename1 = StringToTemplateFile("{valid template}");
    string filename2 = StringToTemplateFile("hi {{>INC:h}} bar\n");

    const Template* cache_tpl1 = cache.GetTemplate(filename1, STRIP_WHITESPACE);
    assert(cache_tpl1);
    AssertExpandIs(cache_tpl1, &dict, "{valid template}", true);
    const Template* cache_tpl2 = cache.GetTemplate(filename2, DO_NOT_STRIP);
    assert(cache_tpl2);
    static_cast<void>(cache_tpl2);  // avoid unused var warning in opt mode
    AssertExpandWithCacheIs(&cache, filename2, DO_NOT_STRIP, &dict, NULL,
                            "hi  bar\n", true);

    // Set the root directory
    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    CreateOrCleanTestDir(pathA);
    cache.SetTemplateRootDirectory(pathA);
    ASSERT(cache.template_root_directory() == pathA);

    // Freeze the cache now, and test its impact.
    cache.Freeze();

    // 1. Loading new templates fails.
    string filename3 = StringToTemplateFile("{yet another valid template}");
    const Template* cache_tpl3 = cache.GetTemplate(filename3, STRIP_WHITESPACE);
    assert(!cache_tpl3);
    static_cast<void>(cache_tpl3);  // avoid unused var warning in opt mode

    // 2. Reloading existing templates fails.
    StringToFile("{file1 contents changed}", filename1);
    cache.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    const Template* cache_tpl1_post_reload = cache.GetTemplate(
        filename1, STRIP_WHITESPACE);
    ASSERT(cache_tpl1_post_reload == cache_tpl1);
    // Check that cache's tpl1 has the same old contents
    AssertExpandIs(cache_tpl1_post_reload, &dict, "{valid template}",
                   true);
    // 3. Cannot delete from a frozen cache.
    cache.Delete(filename1);
    ASSERT(cache.GetTemplate(filename1, STRIP_WHITESPACE));

    // 4. Expand won't load an included template on-demand.
    string incname = StringToTemplateFile("include & print file\n");
    dict.AddIncludeDictionary("INC")->SetFilename(incname);
    AssertExpandWithCacheIs(&cache, filename2, DO_NOT_STRIP, &dict, NULL,
                            "hi  bar\n", false);

    // 5. Cannot change template root directory.
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathB);
    cache.SetTemplateRootDirectory(pathB);
    ASSERT(cache.template_root_directory() == pathA);  // Still the old path

    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);
  }